

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateManager.cpp
# Opt level: O0

unique_ptr<helics::Message,_std::default_delete<helics::Message>_> __thiscall
helics::MessageFederateManager::getMessage(MessageFederateManager *this)

{
  bool bVar1;
  reference this_00;
  __uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true> in_RDI;
  optional<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_> message;
  EndpointData *edat;
  iterator __end1;
  iterator __begin1;
  handle *__range1;
  handle eptDat;
  lock_handle<std::deque<helics::MessageFederateManager::EndpointData,_std::allocator<helics::MessageFederateManager::EndpointData>_>,_std::shared_mutex>
  *in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  shared_guarded_opt<std::deque<helics::MessageFederateManager::EndpointData,_std::allocator<helics::MessageFederateManager::EndpointData>_>,_std::shared_mutex>
  *in_stack_ffffffffffffff78;
  _Self local_80;
  _Self local_50;
  undefined1 *local_30;
  undefined1 local_28 [40];
  
  gmlc::libguarded::
  shared_guarded_opt<std::deque<helics::MessageFederateManager::EndpointData,_std::allocator<helics::MessageFederateManager::EndpointData>_>,_std::shared_mutex>
  ::lock(in_stack_ffffffffffffff78);
  local_30 = local_28;
  gmlc::libguarded::
  lock_handle<std::deque<helics::MessageFederateManager::EndpointData,_std::allocator<helics::MessageFederateManager::EndpointData>_>,_std::shared_mutex>
  ::begin(in_stack_ffffffffffffff38);
  gmlc::libguarded::
  lock_handle<std::deque<helics::MessageFederateManager::EndpointData,_std::allocator<helics::MessageFederateManager::EndpointData>_>,_std::shared_mutex>
  ::end(in_stack_ffffffffffffff38);
  while (bVar1 = std::operator==(&local_50,&local_80), ((bVar1 ^ 0xffU) & 1) != 0) {
    this_00 = std::
              _Deque_iterator<helics::MessageFederateManager::EndpointData,_helics::MessageFederateManager::EndpointData_&,_helics::MessageFederateManager::EndpointData_*>
              ::operator*(&local_50);
    in_stack_ffffffffffffff47 =
         gmlc::containers::
         SimpleQueue<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::mutex>
         ::empty((SimpleQueue<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::mutex>
                  *)0x27e53f);
    if (!(bool)in_stack_ffffffffffffff47) {
      gmlc::containers::
      SimpleQueue<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::mutex>
      ::pop(&this_00->messages);
      bVar1 = std::optional::operator_cast_to_bool
                        ((optional<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>
                          *)0x27e56a);
      if (bVar1) {
        std::optional<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>::
        operator*((optional<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>
                   *)0x27e57a);
        CLI::std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::unique_ptr
                  ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                   CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                   (unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                   in_stack_ffffffffffffff38);
      }
      std::optional<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>::
      ~optional((optional<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>
                 *)0x27e5c0);
      if (bVar1) goto LAB_0027e5f3;
    }
    std::
    _Deque_iterator<helics::MessageFederateManager::EndpointData,_helics::MessageFederateManager::EndpointData_&,_helics::MessageFederateManager::EndpointData_*>
    ::operator++((_Deque_iterator<helics::MessageFederateManager::EndpointData,_helics::MessageFederateManager::EndpointData_&,_helics::MessageFederateManager::EndpointData_*>
                  *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40));
  }
  std::unique_ptr<helics::Message,std::default_delete<helics::Message>>::
  unique_ptr<std::default_delete<helics::Message>,void>
            ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
             CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),in_stack_ffffffffffffff38
            );
LAB_0027e5f3:
  gmlc::libguarded::
  lock_handle<std::deque<helics::MessageFederateManager::EndpointData,_std::allocator<helics::MessageFederateManager::EndpointData>_>,_std::shared_mutex>
  ::~lock_handle((lock_handle<std::deque<helics::MessageFederateManager::EndpointData,_std::allocator<helics::MessageFederateManager::EndpointData>_>,_std::shared_mutex>
                  *)0x27e600);
  return (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
         (tuple<helics::Message_*,_std::default_delete<helics::Message>_>)
         in_RDI.super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t.
         super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
         super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<Message> MessageFederateManager::getMessage()
{
    // just start with the first endpoint and check until a queue isn't empty
    auto eptDat = eptData.lock();
    for (auto& edat : eptDat) {
        if (!edat.messages.empty()) {
            auto message = edat.messages.pop();
            if (message) {
                return std::move(*message);
            }
        }
    }
    return nullptr;
}